

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O0

void alloc_cdef_bufs(AV1_COMMON *cm,uint16_t **colbuf,uint16_t **srcbuf,int num_planes)

{
  void *pvVar1;
  int in_ECX;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  int plane;
  CdefInfo *cdef_info;
  int local_2c;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (*in_RDX == 0) {
    pvVar1 = aom_memalign((size_t)in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
    *in_RDX = (long)pvVar1;
    if (*in_RDX == 0) {
      aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate *srcbuf");
    }
  }
  for (local_2c = 0; local_2c < in_ECX; local_2c = local_2c + 1) {
    if (*(long *)(in_RSI + (long)local_2c * 8) == 0) {
      pvVar1 = aom_malloc(0x6bcc16);
      *(void **)(in_RSI + (long)local_2c * 8) = pvVar1;
      if (*(long *)(in_RSI + (long)local_2c * 8) == 0) {
        aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_MEM_ERROR,
                           "Failed to allocate colbuf[plane]");
      }
    }
  }
  return;
}

Assistant:

static inline void alloc_cdef_bufs(AV1_COMMON *const cm, uint16_t **colbuf,
                                   uint16_t **srcbuf, const int num_planes) {
  CdefInfo *cdef_info = &cm->cdef_info;
  if (*srcbuf == NULL)
    CHECK_MEM_ERROR(cm, *srcbuf,
                    aom_memalign(16, cdef_info->allocated_srcbuf_size));

  for (int plane = 0; plane < num_planes; plane++) {
    if (colbuf[plane] == NULL)
      CHECK_MEM_ERROR(cm, colbuf[plane],
                      aom_malloc(cdef_info->allocated_colbuf_size[plane]));
  }
}